

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O0

void __thiscall DSBarInfo::ScreenSizeChanged(DSBarInfo *this)

{
  int designheight;
  int iVar1;
  int realwidth;
  int realheight;
  DSBarInfo *this_local;
  
  DBaseStatusBar::ScreenSizeChanged(&this->super_DBaseStatusBar);
  iVar1 = FIntCVar::operator_cast_to_int(&uiscale);
  if (iVar1 < 1) {
    iVar1 = this->script->resW;
    designheight = this->script->resH;
    realwidth = DCanvas::GetWidth((DCanvas *)screen);
    realheight = DCanvas::GetHeight((DCanvas *)screen);
    V_CalcCleanFacs(iVar1,designheight,realwidth,realheight,&this->script->cleanX,
                    &this->script->cleanY,(int *)0x0,(int *)0x0);
  }
  else {
    iVar1 = FIntCVar::operator_cast_to_int(&uiscale);
    this->script->cleanX = iVar1;
    iVar1 = FIntCVar::operator_cast_to_int(&uiscale);
    this->script->cleanY = iVar1;
  }
  return;
}

Assistant:

void ScreenSizeChanged()
	{
		Super::ScreenSizeChanged();
		if (uiscale > 0)
		{
			script->cleanX = uiscale;
			script->cleanY = uiscale;
		}
		else
		{
			V_CalcCleanFacs(script->resW, script->resH, SCREENWIDTH, SCREENHEIGHT, &script->cleanX, &script->cleanY);
		}
	}